

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O0

bool __thiscall
cppcms::http::request::read_key_value
          (request *this,const_iterator *p,const_iterator e,string *key,string *value)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  string *in_R8;
  const_iterator tmp;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffec8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffed8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff08;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff10;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff18;
  string local_d0 [32];
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  char *local_10;
  bool local_1;
  
  local_30 = in_R8;
  local_20 = in_RSI;
  local_10 = in_RDX;
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::__normal_iterator(&local_38);
  local_48 = local_20->_M_current;
  local_50 = local_10;
  local_40 = (char *)protocol::
                     skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                               (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  local_20->_M_current = local_40;
  local_38._M_current = local_20->_M_current;
  local_60 = local_20->_M_current;
  local_68 = local_10;
  local_58 = (char *)protocol::
                     tocken<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                               (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  local_20->_M_current = local_58;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
  if ((bVar1) &&
     (bVar1 = __gnu_cxx::operator<
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8), bVar1))
  {
    local_70 = local_10;
    (anonymous_namespace)::
    skip_after_period<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
    local_1 = false;
  }
  else {
    local_78 = local_38._M_current;
    local_80 = local_20->_M_current;
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              (in_stack_ffffffffffffff00,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_90 = local_20->_M_current;
    local_98 = local_10;
    local_88 = (char *)protocol::
                       skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                 (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    local_20->_M_current = local_88;
    bVar1 = __gnu_cxx::operator<
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
    if (bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_20);
      if ((*pcVar2 == '=') ||
         ((pcVar2 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(local_20), *pcVar2 != ';' &&
          (pcVar2 = __gnu_cxx::
                    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(local_20), *pcVar2 != ',')))) {
        local_a8 = (char *)__gnu_cxx::
                           __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ::operator+(in_stack_fffffffffffffed8,
                                       in_stack_fffffffffffffed0._M_current);
        local_b0 = local_10;
        local_a0 = (char *)protocol::
                           skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                                     (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
        local_20->_M_current = local_a0;
        bVar1 = __gnu_cxx::operator<
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
        if (bVar1) {
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(local_20);
          if (*pcVar2 == '\"') {
            local_38._M_current = local_20->_M_current;
            protocol::unquote<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff10._M_current,in_stack_ffffffffffffff18);
            std::__cxx11::string::operator=(local_30,local_d0);
            std::__cxx11::string::~string(local_d0);
            bVar1 = __gnu_cxx::operator==
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
            if (bVar1) {
              local_20->_M_current = local_10;
              return false;
            }
          }
          else {
            local_38._M_current = local_20->_M_current;
            _Var3 = protocol::tocken<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            local_20->_M_current = _Var3._M_current;
            std::__cxx11::string::
            assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_20->_M_current,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_10,local_38);
            bVar1 = __gnu_cxx::operator==
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
            if ((((bVar1) &&
                 (bVar1 = __gnu_cxx::operator<
                                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)in_stack_fffffffffffffed0._M_current,
                                     in_stack_fffffffffffffec8), bVar1)) &&
                (pcVar2 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator*(local_20), *pcVar2 != ';')) &&
               (pcVar2 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(local_20), *pcVar2 != ',')) {
              (anonymous_namespace)::
              skip_after_period<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
              return false;
            }
          }
          _Var3 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          local_20->_M_current = _Var3._M_current;
          bVar1 = __gnu_cxx::operator<
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)in_stack_fffffffffffffed0._M_current,in_stack_fffffffffffffec8);
          if ((bVar1) &&
             ((pcVar2 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(local_20), *pcVar2 == ';' ||
              (pcVar2 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(local_20), *pcVar2 == ',')))) {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+(in_stack_fffffffffffffed8,
                        (difference_type)in_stack_fffffffffffffed0._M_current);
            _Var3 = protocol::
                    skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              (in_stack_fffffffffffffef8,_Var3);
            local_20->_M_current = _Var3._M_current;
          }
          local_1 = true;
        }
        else {
          local_1 = true;
        }
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_20);
        local_1 = true;
      }
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool request::read_key_value(
		std::string::const_iterator &p,
		std::string::const_iterator e,
		std::string &key,
		std::string &value)
{
	std::string::const_iterator tmp;
	p=http::protocol::skip_ws(p,e);
	tmp=p;
	p=http::protocol::tocken(p,e);
	if(p==tmp && p<e) {
		skip_after_period(p,e);
		return false;
	}
	key.assign(tmp,p);
	p=http::protocol::skip_ws(p,e);
	if(p<e) {
		if(*p!='=') {
			if(*p==';' || *p==',') {
				++p;
				return true;
			}
		}
	}
	else {
		return true;
	}
	p=http::protocol::skip_ws(p+1,e);
	if(p < e) {
		if(*p=='"') {
			tmp=p;
			value=http::protocol::unquote(p,e);
			if(p==tmp) {
				p=e;
				return false;
			}
		}
		else {
			tmp=p;
			p=http::protocol::tocken(p,e);
			value.assign(tmp,p);
			if(p==tmp && p<e && *p!=';'&& *p!=',') {
				skip_after_period(p,e);
				return false;
			}
		}
	}
	else {
		return true;
	}
	p=http::protocol::skip_ws(p,e);
	if(p<e && (*p==';' || *p==',' ))
		p=http::protocol::skip_ws(p+1,e);
	return true;
}